

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

fasttext_args_t * cft_fasttext_get_args(fasttext_t *handle)

{
  Args *this;
  stringstream ss;
  Args args;
  stringstream asStack_328 [16];
  ostream local_318 [376];
  Args local_1a0;
  
  std::__cxx11::stringstream::stringstream(asStack_328);
  fasttext::FastText::getArgs(&local_1a0,(FastText *)handle);
  fasttext::Args::save(&local_1a0,local_318);
  this = (Args *)operator_new(400);
  fasttext::Args::Args(this);
  fasttext::Args::load(this,(istream *)asStack_328);
  fasttext::Args::~Args(&local_1a0);
  std::__cxx11::stringstream::~stringstream(asStack_328);
  return (fasttext_args_t *)this;
}

Assistant:

fasttext_args_t* cft_fasttext_get_args(fasttext_t* handle) {
    FastText* x = (FastText*)handle;
    std::stringstream ss;
    Args args = x->getArgs();
    args.save(ss);
    Args* new_args = new Args();
    new_args->load(ss);
    return (fasttext_args_t*)new_args;
}